

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall JsonString_Simple_Test::~JsonString_Simple_Test(JsonString_Simple_Test *this)

{
  anon_unknown.dwarf_1a1265::JsonString::~JsonString(&this->super_JsonString);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, Simple) {
    EXPECT_CALL (callbacks_, string_value ("hello")).Times (1);

    json::parser<decltype (proxy_)> p = json::make_parser (proxy_);
    p.input (R"("hello")"s).eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{8U, 1U}));
}